

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MIL.pb.cc
# Opt level: O3

void __thiscall CoreML::Specification::MILSpec::Value::Value(Value *this,Value *from)

{
  InternalMetadata *this_00;
  ulong uVar1;
  ValueType *from_00;
  ValueType *this_01;
  Value_ImmediateValue *this_02;
  Value_BlobFileValue *this_03;
  undefined8 *puVar2;
  ulong uVar3;
  undefined1 *puVar4;
  Arena *pAVar5;
  
  this_00 = &(this->super_MessageLite)._internal_metadata_;
  (this->super_MessageLite)._internal_metadata_.ptr_ = 0;
  (this->super_MessageLite)._vptr_MessageLite = (_func_int **)&PTR__Value_00484ed0;
  (this->_cached_size_).size_.super___atomic_base<int>._M_i = 0;
  uVar3 = (from->super_MessageLite)._internal_metadata_.ptr_;
  if ((uVar3 & 1) != 0) {
    google::protobuf::internal::InternalMetadata::DoMergeFrom<std::__cxx11::string>
              (this_00,(string *)((uVar3 & 0xfffffffffffffffc) + 8));
  }
  (this->docstring_).tagged_ptr_.ptr_ =
       &google::protobuf::internal::fixed_address_empty_string_abi_cxx11_;
  uVar3 = (ulong)(from->docstring_).tagged_ptr_.ptr_ & 0xfffffffffffffffe;
  if (*(long *)(uVar3 + 8) != 0) {
    uVar1 = this_00->ptr_;
    puVar2 = (undefined8 *)(uVar1 & 0xfffffffffffffffc);
    if ((uVar1 & 1) != 0) {
      puVar2 = (undefined8 *)*puVar2;
    }
    google::protobuf::internal::ArenaStringPtr::Set(&this->docstring_,uVar3,puVar2);
  }
  from_00 = from->type_;
  if (from_00 == (ValueType *)0x0 || from == (Value *)_Value_default_instance_) {
    this_01 = (ValueType *)0x0;
  }
  else {
    this_01 = (ValueType *)operator_new(0x20);
    ValueType::ValueType(this_01,from_00);
  }
  this->type_ = this_01;
  this->_oneof_case_[0] = 0;
  if (from->_oneof_case_[0] == 5) {
    clear_value(this);
    this->_oneof_case_[0] = 5;
    uVar3 = (this->super_MessageLite)._internal_metadata_.ptr_;
    pAVar5 = (Arena *)(uVar3 & 0xfffffffffffffffc);
    if ((uVar3 & 1) != 0) {
      pAVar5 = *(Arena **)pAVar5;
    }
    this_03 = google::protobuf::Arena::
              CreateMaybeMessage<CoreML::Specification::MILSpec::Value_BlobFileValue>(pAVar5);
    (this->value_).blobfilevalue_ = this_03;
    if (from->_oneof_case_[0] == 5) {
      puVar4 = (undefined1 *)(from->value_).blobfilevalue_;
    }
    else {
      puVar4 = _Value_BlobFileValue_default_instance_;
    }
    Value_BlobFileValue::MergeFrom(this_03,(Value_BlobFileValue *)puVar4);
  }
  else if (from->_oneof_case_[0] == 3) {
    clear_value(this);
    this->_oneof_case_[0] = 3;
    uVar3 = (this->super_MessageLite)._internal_metadata_.ptr_;
    pAVar5 = (Arena *)(uVar3 & 0xfffffffffffffffc);
    if ((uVar3 & 1) != 0) {
      pAVar5 = *(Arena **)pAVar5;
    }
    this_02 = google::protobuf::Arena::
              CreateMaybeMessage<CoreML::Specification::MILSpec::Value_ImmediateValue>(pAVar5);
    (this->value_).immediatevalue_ = this_02;
    if (from->_oneof_case_[0] == 3) {
      puVar4 = (undefined1 *)(from->value_).immediatevalue_;
    }
    else {
      puVar4 = _Value_ImmediateValue_default_instance_;
    }
    Value_ImmediateValue::MergeFrom(this_02,(Value_ImmediateValue *)puVar4);
  }
  return;
}

Assistant:

Value::Value(const Value& from)
  : ::PROTOBUF_NAMESPACE_ID::MessageLite() {
  _internal_metadata_.MergeFrom<std::string>(from._internal_metadata_);
  docstring_.UnsafeSetDefault(&::PROTOBUF_NAMESPACE_ID::internal::GetEmptyStringAlreadyInited());
  #ifdef PROTOBUF_FORCE_COPY_DEFAULT_STRING
    docstring_.Set(&::PROTOBUF_NAMESPACE_ID::internal::GetEmptyStringAlreadyInited(), "", GetArenaForAllocation());
  #endif // PROTOBUF_FORCE_COPY_DEFAULT_STRING
  if (!from._internal_docstring().empty()) {
    docstring_.Set(::PROTOBUF_NAMESPACE_ID::internal::ArenaStringPtr::EmptyDefault{}, from._internal_docstring(), 
      GetArenaForAllocation());
  }
  if (from._internal_has_type()) {
    type_ = new ::CoreML::Specification::MILSpec::ValueType(*from.type_);
  } else {
    type_ = nullptr;
  }
  clear_has_value();
  switch (from.value_case()) {
    case kImmediateValue: {
      _internal_mutable_immediatevalue()->::CoreML::Specification::MILSpec::Value_ImmediateValue::MergeFrom(from._internal_immediatevalue());
      break;
    }
    case kBlobFileValue: {
      _internal_mutable_blobfilevalue()->::CoreML::Specification::MILSpec::Value_BlobFileValue::MergeFrom(from._internal_blobfilevalue());
      break;
    }
    case VALUE_NOT_SET: {
      break;
    }
  }
  // @@protoc_insertion_point(copy_constructor:CoreML.Specification.MILSpec.Value)
}